

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O0

void Assimp::Write(JSONWriter *out,aiTexture *ai,bool is_elem)

{
  aiTexture *paVar1;
  char *__s;
  uint local_518;
  uint local_514;
  uint local_510;
  uint local_50c;
  aiTexel *local_508;
  aiTexel *tx;
  uint local_4f8;
  uint x;
  uint y;
  allocator<char> local_4c9;
  string local_4c8;
  aiString local_4a8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  undefined1 local_19;
  aiTexture *paStack_18;
  bool is_elem_local;
  aiTexture *ai_local;
  JSONWriter *out_local;
  
  local_19 = is_elem;
  paStack_18 = ai;
  ai_local = (aiTexture *)out;
  JSONWriter::StartObj(out,is_elem);
  paVar1 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"width",&local_41);
  JSONWriter::Key((JSONWriter *)paVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  JSONWriter::SimpleValue<unsigned_int>((JSONWriter *)ai_local,&paStack_18->mWidth);
  paVar1 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"height",&local_79);
  JSONWriter::Key((JSONWriter *)paVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  JSONWriter::SimpleValue<unsigned_int>((JSONWriter *)ai_local,&paStack_18->mHeight);
  paVar1 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"formathint",&local_a1);
  JSONWriter::Key((JSONWriter *)paVar1,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  paVar1 = ai_local;
  __s = paStack_18->achFormatHint;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,__s,&local_4c9);
  aiString::aiString(&local_4a8,&local_4c8);
  JSONWriter::SimpleValue<aiString>((JSONWriter *)paVar1,&local_4a8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  paVar1 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&y,"data",(allocator<char> *)((long)&x + 3));
  JSONWriter::Key((JSONWriter *)paVar1,(string *)&y);
  std::__cxx11::string::~string((string *)&y);
  std::allocator<char>::~allocator((allocator<char> *)((long)&x + 3));
  if (paStack_18->mHeight == 0) {
    JSONWriter::SimpleValue((JSONWriter *)ai_local,paStack_18->pcData,(ulong)paStack_18->mWidth);
  }
  else {
    JSONWriter::StartArray((JSONWriter *)ai_local,false);
    for (local_4f8 = 0; local_4f8 < paStack_18->mHeight; local_4f8 = local_4f8 + 1) {
      JSONWriter::StartArray((JSONWriter *)ai_local,true);
      for (tx._4_4_ = 0; tx._4_4_ < paStack_18->mWidth; tx._4_4_ = tx._4_4_ + 1) {
        local_508 = paStack_18->pcData + (local_4f8 * paStack_18->mWidth + tx._4_4_);
        JSONWriter::StartArray((JSONWriter *)ai_local,true);
        local_50c = (uint)local_508->r;
        JSONWriter::Element<unsigned_int>((JSONWriter *)ai_local,&local_50c);
        local_510 = (uint)local_508->g;
        JSONWriter::Element<unsigned_int>((JSONWriter *)ai_local,&local_510);
        local_514 = (uint)local_508->b;
        JSONWriter::Element<unsigned_int>((JSONWriter *)ai_local,&local_514);
        local_518 = (uint)local_508->a;
        JSONWriter::Element<unsigned_int>((JSONWriter *)ai_local,&local_518);
        JSONWriter::EndArray((JSONWriter *)ai_local);
      }
      JSONWriter::EndArray((JSONWriter *)ai_local);
    }
    JSONWriter::EndArray((JSONWriter *)ai_local);
  }
  JSONWriter::EndObj((JSONWriter *)ai_local);
  return;
}

Assistant:

void Write(JSONWriter& out, const aiTexture& ai, bool is_elem = true) {
    out.StartObj(is_elem);

    out.Key("width");
    out.SimpleValue(ai.mWidth);

    out.Key("height");
    out.SimpleValue(ai.mHeight);

    out.Key("formathint");
    out.SimpleValue(aiString(ai.achFormatHint));

    out.Key("data");
    if (!ai.mHeight) {
        out.SimpleValue(ai.pcData, ai.mWidth);
    }
    else {
        out.StartArray();
        for (unsigned int y = 0; y < ai.mHeight; ++y) {
            out.StartArray(true);
            for (unsigned int x = 0; x < ai.mWidth; ++x) {
                const aiTexel& tx = ai.pcData[y*ai.mWidth + x];
                out.StartArray(true);
                out.Element(static_cast<unsigned int>(tx.r));
                out.Element(static_cast<unsigned int>(tx.g));
                out.Element(static_cast<unsigned int>(tx.b));
                out.Element(static_cast<unsigned int>(tx.a));
                out.EndArray();
            }
            out.EndArray();
        }
        out.EndArray();
    }

    out.EndObj();
}